

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall JtagAnalyzer::JtagAnalyzer(JtagAnalyzer *this)

{
  JtagAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__JtagAnalyzer_00121c90;
  JtagAnalyzerSettings::JtagAnalyzerSettings(&this->mSettings);
  std::auto_ptr<JtagAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  JtagSimulationDataGenerator::JtagSimulationDataGenerator(&this->mSimulationDataGenerator);
  JtagTAP_Controller::JtagTAP_Controller(&this->mTAPCtrl);
  this->mSimulationInitilized = false;
  Analyzer::UseFrameV2();
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

JtagAnalyzer::JtagAnalyzer() : mSimulationInitilized( false )
{
    UseFrameV2();
    SetAnalyzerSettings( &mSettings );
}